

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O2

uint lcp(uint32_t a,uint32_t b)

{
  uint uVar1;
  
  if (a != 0 && a == b) {
    __assert_fail("a != b or a==0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x3ff,"unsigned int lcp(uint32_t, uint32_t)");
  }
  uVar1 = 0;
  if ((a & 0xff000000) == (b & 0xff000000) && (a & 0xff000000) != 0) {
    if ((a & 0xff0000) != (b & 0xff0000) || (a & 0xff0000) == 0) {
      return 1;
    }
    uVar1 = ((a & 0xff00) == (b & 0xff00) && (a & 0xff00) != 0) | 2;
  }
  return uVar1;
}

Assistant:

static inline unsigned lcp(uint32_t a, uint32_t b)
{
	assert(a != b or a==0);
	unsigned A, B;
	A = 0xFF000000 & a;
	B = 0xFF000000 & b;
	if (A==0 or A!=B) return 0;
	A = 0x00FF0000 & a;
	B = 0x00FF0000 & b;
	if (A==0 or A!=B) return 1;
	A = 0x0000FF00 & a;
	B = 0x0000FF00 & b;
	if (A==0 or A!=B) return 2;
	return 3;
}